

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::DWARFDebugRnglistTable>::~Expected
          (Expected<llvm::DWARFDebugRnglistTable> *this)

{
  error_type *this_00;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_01;
  
  if ((this->field_0x98 & 1) != 0) {
    this_00 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_00);
    return;
  }
  this_01 = &getStorage(this)->super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
  DWARFListTableBase<llvm::DWARFDebugRnglist>::~DWARFListTableBase(this_01);
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }